

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs_impl::path_cs_ext::path_info>::~holder
          (holder<cs_impl::path_cs_ext::path_info> *this)

{
  baseHolder *in_RDI;
  
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_006ba810;
  path_cs_ext::path_info::~path_info((path_info *)0x4e5b9a);
  baseHolder::~baseHolder(in_RDI);
  return;
}

Assistant:

~ holder() override = default;